

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O3

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,Var getter,Var setter)

{
  this->Attributes = '\a';
  Memory::Recycler::WBSetBit((char *)&this->Getter);
  (this->Getter).ptr = getter;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Getter);
  Memory::Recycler::WBSetBit((char *)&this->Setter);
  (this->Setter).ptr = setter;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Setter);
  return;
}

Assistant:

IndexPropertyDescriptor(Var getter, Var setter)
            : Attributes(PropertyDynamicTypeDefaults), Getter(getter), Setter(setter)
        {
        }